

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int create_event_sender(TELEMETRY_MESSENGER_INSTANCE_conflict *instance)

{
  SESSION_HANDLE session;
  int iVar1;
  STRING_HANDLE devices_and_modules_path_00;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LINK_HANDLE pLVar4;
  MESSAGE_SENDER_HANDLE pMVar5;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  STRING_HANDLE event_send_address;
  STRING_HANDLE devices_and_modules_path;
  AMQP_VALUE target;
  AMQP_VALUE source;
  STRING_HANDLE source_name;
  STRING_HANDLE link_name;
  int result;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance_local;
  
  source_name = (STRING_HANDLE)0x0;
  source = (AMQP_VALUE)0x0;
  target = (AMQP_VALUE)0x0;
  devices_and_modules_path = (STRING_HANDLE)0x0;
  l = (LOGGER_LOG)0x0;
  devices_and_modules_path_00 =
       create_devices_and_modules_path
                 (instance->iothub_host_fqdn,instance->device_id,instance->module_id);
  if (devices_and_modules_path_00 == (STRING_HANDLE)0x0) {
    link_name._4_4_ = 0x199;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"create_event_sender",0x19a,1,
                "Failed creating the message sender (failed creating the \'devices_and_modules_path\')"
               );
    }
  }
  else {
    l = (LOGGER_LOG)create_event_send_address(devices_and_modules_path_00);
    if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
      link_name._4_4_ = 0x19e;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"create_event_sender",0x19f,1,
                  "Failed creating the message sender (failed creating the \'event_send_address\')")
        ;
      }
    }
    else {
      pcVar3 = STRING_c_str(instance->device_id);
      source_name = create_link_name("link-snd",pcVar3);
      if (source_name == (STRING_HANDLE)0x0) {
        link_name._4_4_ = 0x1a3;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"create_event_sender",0x1a4,1,
                    "Failed creating the message sender (failed creating an unique link name)");
        }
      }
      else {
        source = (AMQP_VALUE)create_event_sender_source_name(source_name);
        if (source == (AMQP_VALUE)0x0) {
          link_name._4_4_ = 0x1a8;
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                      ,"create_event_sender",0x1a9,1,
                      "Failed creating the message sender (failed creating an unique source name)");
          }
        }
        else {
          pcVar3 = STRING_c_str((STRING_HANDLE)source);
          target = messaging_create_source(pcVar3);
          if (target == (AMQP_VALUE)0x0) {
            link_name._4_4_ = 0x1ad;
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                        ,"create_event_sender",0x1ae,1,
                        "Failed creating the message sender (messaging_create_source failed)");
            }
          }
          else {
            pcVar3 = STRING_c_str((STRING_HANDLE)l);
            devices_and_modules_path = (STRING_HANDLE)messaging_create_target(pcVar3);
            if ((AMQP_VALUE)devices_and_modules_path == (AMQP_VALUE)0x0) {
              link_name._4_4_ = 0x1b2;
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                          ,"create_event_sender",0x1b3,1,
                          "Failed creating the message sender (messaging_create_target failed)");
              }
            }
            else {
              session = instance->session_handle;
              pcVar3 = STRING_c_str(source_name);
              pLVar4 = link_create(session,pcVar3,false,target,(AMQP_VALUE)devices_and_modules_path)
              ;
              instance->sender_link = pLVar4;
              if (pLVar4 == (LINK_HANDLE)0x0) {
                link_name._4_4_ = 0x1b7;
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                            ,"create_event_sender",0x1b8,1,
                            "Failed creating the message sender (link_create failed)");
                }
              }
              else {
                iVar1 = link_set_max_message_size(instance->sender_link,0xffffffffffffffff);
                if ((iVar1 != 0) &&
                   (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                            ,"create_event_sender",0x1be,1,
                            "Failed setting message sender link max message size.");
                }
                attach_device_client_type_to_link
                          (instance->sender_link,instance->prod_info_cb,instance->prod_info_ctx);
                pMVar5 = messagesender_create
                                   (instance->sender_link,on_event_sender_state_changed_callback,
                                    instance);
                instance->message_sender = pMVar5;
                if (pMVar5 == (MESSAGE_SENDER_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                              ,"create_event_sender",0x1c5,1,
                              "Failed creating the message sender (messagesender_create failed)");
                  }
                  destroy_event_sender(instance);
                  link_name._4_4_ = 0x1c7;
                }
                else {
                  iVar1 = messagesender_open(instance->message_sender);
                  if (iVar1 == 0) {
                    link_name._4_4_ = 0;
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                                ,"create_event_sender",0x1cd,1,
                                "Failed opening the AMQP message sender.");
                    }
                    destroy_event_sender(instance);
                    link_name._4_4_ = 0x1cf;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (source_name != (STRING_HANDLE)0x0) {
    STRING_delete(source_name);
  }
  if (source != (AMQP_VALUE)0x0) {
    STRING_delete((STRING_HANDLE)source);
  }
  if (target != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(target);
  }
  if (devices_and_modules_path != (STRING_HANDLE)0x0) {
    amqpvalue_destroy((AMQP_VALUE)devices_and_modules_path);
  }
  if (devices_and_modules_path_00 != (STRING_HANDLE)0x0) {
    STRING_delete(devices_and_modules_path_00);
  }
  if (l != (LOGGER_LOG)0x0) {
    STRING_delete((STRING_HANDLE)l);
  }
  return link_name._4_4_;
}

Assistant:

static int create_event_sender(TELEMETRY_MESSENGER_INSTANCE* instance)
{
    int result;

    STRING_HANDLE link_name = NULL;
    STRING_HANDLE source_name = NULL;
    AMQP_VALUE source = NULL;
    AMQP_VALUE target = NULL;
    STRING_HANDLE devices_and_modules_path = NULL;
    STRING_HANDLE event_send_address = NULL;

    if ((devices_and_modules_path = create_devices_and_modules_path(instance->iothub_host_fqdn, instance->device_id, instance->module_id)) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (failed creating the 'devices_and_modules_path')");
    }
    else if ((event_send_address = create_event_send_address(devices_and_modules_path)) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (failed creating the 'event_send_address')");
    }
    else if ((link_name = create_link_name(MESSAGE_SENDER_LINK_NAME_PREFIX, STRING_c_str(instance->device_id))) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (failed creating an unique link name)");
    }
    else if ((source_name = create_event_sender_source_name(link_name)) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (failed creating an unique source name)");
    }
    else if ((source = messaging_create_source(STRING_c_str(source_name))) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (messaging_create_source failed)");
    }
    else if ((target = messaging_create_target(STRING_c_str(event_send_address))) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (messaging_create_target failed)");
    }
    else if ((instance->sender_link = link_create(instance->session_handle, STRING_c_str(link_name), role_sender, source, target)) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the message sender (link_create failed)");
    }
    else
    {
        if (link_set_max_message_size(instance->sender_link, MESSAGE_SENDER_MAX_LINK_SIZE) != RESULT_OK)
        {
            LogError("Failed setting message sender link max message size.");
        }

        attach_device_client_type_to_link(instance->sender_link, instance->prod_info_cb, instance->prod_info_ctx);

        if ((instance->message_sender = messagesender_create(instance->sender_link, on_event_sender_state_changed_callback, (void*)instance)) == NULL)
        {
            LogError("Failed creating the message sender (messagesender_create failed)");
            destroy_event_sender(instance);
            result = MU_FAILURE;
        }
        else
        {
            if (messagesender_open(instance->message_sender) != RESULT_OK)
            {
                LogError("Failed opening the AMQP message sender.");
                destroy_event_sender(instance);
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
    }

    if (link_name != NULL)
        STRING_delete(link_name);
    if (source_name != NULL)
        STRING_delete(source_name);
    if (source != NULL)
        amqpvalue_destroy(source);
    if (target != NULL)
        amqpvalue_destroy(target);
    if (devices_and_modules_path != NULL)
        STRING_delete(devices_and_modules_path);
    if (event_send_address != NULL)
        STRING_delete(event_send_address);

    return result;
}